

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  runtime_error *this;
  long *plVar2;
  initializer_list<FBX::Process_*> __l;
  Decoder decoder;
  Parser parser;
  Node root;
  allocator_type local_1da;
  less<FBX::Process_*> local_1d9;
  undefined1 local_1d8 [8];
  string local_1d0;
  _Base_ptr local_1b0;
  Decoder local_1a8;
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  local_120;
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  local_f0;
  Parser local_c0;
  Node local_88;
  
  std::chrono::_V2::system_clock::now();
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Fox.fbx","");
  local_1b0 = (_Base_ptr)operator_new(8);
  *(undefined ***)local_1b0 = &PTR__Process_00116d38;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1b0;
  std::set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>::set
            ((set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_> *)
             &local_120,__l,&local_1d9,&local_1da);
  FBX::Decoder::Decoder(&local_1a8,&local_1d0);
  FBX::Decoder::readFile(&local_88,&local_1a8);
  std::
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  ::_Rb_tree(&local_f0,&local_120);
  local_c0.root = &local_88;
  std::
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  ::_Rb_tree(&local_c0.processes._M_t,&local_f0);
  std::
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  ::~_Rb_tree(&local_f0);
  FBX::Parser::parseScene((Parser *)local_1d8);
  FBX::Parser::~Parser(&local_c0);
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~vector(&local_88.properties);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_88.children);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.id._M_dataplus._M_p != &local_88.id.field_2) {
    operator_delete(local_88.id._M_dataplus._M_p,local_88.id.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8.blockData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.blockData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.blockData.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.blockData.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  FBX::Stream::~Stream(&local_1a8.stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.path._M_dataplus._M_p != &local_1a8.path.field_2) {
    operator_delete(local_1a8.path._M_dataplus._M_p,local_1a8.path.field_2._M_allocated_capacity + 1
                   );
  }
  std::
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  ::~_Rb_tree(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  plVar2 = *(long **)(*(long *)(**(long **)local_1d8 + 8) + 0x28);
  while( true ) {
    if (plVar2 == *(long **)(*(long *)(**(long **)local_1d8 + 8) + 0x30)) {
      std::chrono::_V2::system_clock::now();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Took ",5);
      poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," milliseconds to read file",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_>::~unique_ptr
                ((unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_> *)local_1d8);
      return 0;
    }
    if (plVar2[1] - *plVar2 != 0xc) break;
    plVar2 = plVar2 + 3;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_1a8.path,plVar2[1] - *plVar2 >> 2);
  std::runtime_error::runtime_error(this,(string *)&local_1a8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char *argv[]) {
    auto t1 = std::chrono::high_resolution_clock::now();

    const auto &result = FBX::importFile("Fox.fbx", std::set<FBX::Process*>{new FBX::TriangulateProcess()});

    for (const auto &face : result->models[0]->mesh->faces)
        if (face.indices.size() != 3)
            throw std::runtime_error(std::to_string(face.indices.size()));

    auto t2 = std::chrono::high_resolution_clock::now();
    std::cout << "Took " << std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count()
              << " milliseconds to read file" << std::endl;

    // Use the mesh

    return EXIT_SUCCESS;
}